

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O2

void __thiscall QTextBrowser::focusOutEvent(QTextBrowser *this,QFocusEvent *ev)

{
  long lVar1;
  QWidget *this_00;
  TextInteractionFlags TVar2;
  long in_FS_OFFSET;
  QCursor local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QTextEdit).super_QAbstractScrollArea.super_QFrame.super_QWidget.
                    field_0x8;
  this_00 = *(QWidget **)(lVar1 + 0x2b0);
  TVar2 = QWidgetTextControl::textInteractionFlags(*(QWidgetTextControl **)(lVar1 + 0x2f8));
  if (((uint)TVar2.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0) {
    QCursor::QCursor(&local_30,(QCursor *)(lVar1 + 0x428));
  }
  else {
    QCursor::QCursor(&local_30,IBeamCursor);
  }
  QWidget::setCursor(this_00,&local_30);
  QCursor::~QCursor(&local_30);
  QTextEdit::focusOutEvent(&this->super_QTextEdit,ev);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextBrowser::focusOutEvent(QFocusEvent *ev)
{
#ifndef QT_NO_CURSOR
    Q_D(QTextBrowser);
    d->viewport->setCursor((!(d->control->textInteractionFlags() & Qt::TextEditable)) ? d->oldCursor : Qt::IBeamCursor);
#endif
    QTextEdit::focusOutEvent(ev);
}